

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O0

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,
          DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *depgraph,
          Span<const_unsigned_int> mapping)

{
  bool bVar1;
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  *this_00;
  char *assertion;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  Iterator *this_01;
  Iterator *pIVar5;
  char *in_RDI;
  long in_FS_OFFSET;
  uint j_1;
  IntBitSet<unsigned_int> *__range3_1;
  ClusterIndex i_1;
  uint j;
  IntBitSet<unsigned_int> *__range3;
  value_type *output;
  value_type *input;
  ClusterIndex i;
  IteratorEnd __end0_1;
  Iterator __begin0_1;
  IteratorEnd __end0;
  Iterator __begin0;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  Iterator *in_stack_ffffffffffffff40;
  Span<const_unsigned_int> *in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff58;
  int line;
  char *file;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint local_74;
  uint local_4c;
  char local_19 [17];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             *)TxCount((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  file = local_19;
  std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>::
  allocator((allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>
             *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::vector(this_00,(size_type)in_RDI,in_stack_ffffffffffffff58);
  line = (int)((ulong)this_00 >> 0x20);
  std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>::
  ~allocator((allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>
              *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  assertion = (char *)Span<const_unsigned_int>::size
                                ((Span<const_unsigned_int> *)
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  TxCount((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  inline_assertion_check<true,bool>
            ((bool *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),file,line,in_RDI,
             assertion);
  local_4c = 0;
  while( true ) {
    sVar2 = TxCount((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (sVar2 <= local_4c) break;
    pvVar3 = std::
             vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                           *)in_stack_ffffffffffffff48,(size_type)in_stack_ffffffffffffff40);
    Span<const_unsigned_int>::operator[]
              (in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
    pvVar4 = std::
             vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                           *)in_stack_ffffffffffffff48,(size_type)in_stack_ffffffffffffff40);
    (pvVar4->feerate).fee = (pvVar3->feerate).fee;
    (pvVar4->feerate).size = (pvVar3->feerate).size;
    bitset_detail::IntBitSet<unsigned_int>::begin
              ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff40);
    bitset_detail::IntBitSet<unsigned_int>::end
              ((IntBitSet<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while( true ) {
      bVar1 = bitset_detail::operator==
                        ((Iterator *)in_stack_ffffffffffffff48,
                         (IteratorEnd *)in_stack_ffffffffffffff40);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator*(in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff48 = (Span<const_unsigned_int> *)&pvVar4->ancestors;
      Span<const_unsigned_int>::operator[]
                (in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
      bitset_detail::IntBitSet<unsigned_int>::Set
                ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator++(in_stack_ffffffffffffff40);
    }
    local_4c = local_4c + 1;
  }
  local_74 = 0;
  while( true ) {
    this_01 = (Iterator *)(ulong)local_74;
    pIVar5 = (Iterator *)
             std::
             vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ::size((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                     *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (pIVar5 <= this_01) break;
    std::
    vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                  *)in_stack_ffffffffffffff48,(size_type)this_01);
    bitset_detail::IntBitSet<unsigned_int>::begin((IntBitSet<unsigned_int> *)this_01);
    bitset_detail::IntBitSet<unsigned_int>::end
              ((IntBitSet<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while( true ) {
      bVar1 = bitset_detail::operator==
                        ((Iterator *)in_stack_ffffffffffffff48,(IteratorEnd *)this_01);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator*(this_01);
      std::
      vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    *)in_stack_ffffffffffffff48,(size_type)this_01);
      bitset_detail::IntBitSet<unsigned_int>::Set
                ((IntBitSet<unsigned_int> *)this_01,in_stack_ffffffffffffff3c);
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator++(this_01);
    }
    local_74 = local_74 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DepGraph(const DepGraph<SetType>& depgraph, Span<const ClusterIndex> mapping) noexcept : entries(depgraph.TxCount())
    {
        Assert(mapping.size() == depgraph.TxCount());
        // Fill in fee, size, ancestors.
        for (ClusterIndex i = 0; i < depgraph.TxCount(); ++i) {
            const auto& input = depgraph.entries[i];
            auto& output = entries[mapping[i]];
            output.feerate = input.feerate;
            for (auto j : input.ancestors) output.ancestors.Set(mapping[j]);
        }
        // Fill in descendant information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            for (auto j : entries[i].ancestors) {
                entries[j].descendants.Set(i);
            }
        }
    }